

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_tri_uv_bounding_sphere3(REF_GEOM ref_geom,REF_INT *nodes,REF_DBL *center,REF_DBL *radius)

{
  double dVar1;
  double dVar2;
  double dVar3;
  REF_DBL local_d0;
  REF_DBL local_b0;
  REF_DBL local_90;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT sens;
  REF_DBL uv2 [2];
  REF_DBL uv1 [2];
  REF_DBL uv0 [2];
  REF_DBL *radius_local;
  REF_DBL *center_local;
  REF_INT *nodes_local;
  REF_GEOM ref_geom_local;
  
  ref_geom_local._4_4_ =
       ref_geom_cell_tuv(ref_geom,*nodes,nodes,2,uv1 + 1,&ref_private_macro_code_rss_1);
  if (ref_geom_local._4_4_ == 0) {
    ref_geom_local._4_4_ =
         ref_geom_cell_tuv(ref_geom,nodes[1],nodes,2,uv2 + 1,&ref_private_macro_code_rss_1);
    if (ref_geom_local._4_4_ == 0) {
      ref_geom_local._4_4_ =
           ref_geom_cell_tuv(ref_geom,nodes[2],nodes,2,(REF_DBL *)&ref_private_macro_code_rss,
                             &ref_private_macro_code_rss_1);
      if (ref_geom_local._4_4_ == 0) {
        *center = (uv1[1] + uv2[1] + _ref_private_macro_code_rss) / 3.0;
        center[1] = (uv0[0] + uv1[0] + uv2[0]) / 3.0;
        *radius = 0.0;
        dVar3 = *radius;
        dVar1 = pow(uv1[1] - *center,2.0);
        dVar2 = pow(uv0[0] - center[1],2.0);
        dVar1 = sqrt(dVar1 + dVar2);
        if (dVar3 <= dVar1) {
          dVar3 = pow(uv1[1] - *center,2.0);
          dVar1 = pow(uv0[0] - center[1],2.0);
          local_90 = sqrt(dVar3 + dVar1);
        }
        else {
          local_90 = *radius;
        }
        *radius = local_90;
        dVar3 = *radius;
        dVar1 = pow(uv2[1] - *center,2.0);
        dVar2 = pow(uv1[0] - center[1],2.0);
        dVar1 = sqrt(dVar1 + dVar2);
        if (dVar3 <= dVar1) {
          dVar3 = pow(uv2[1] - *center,2.0);
          dVar1 = pow(uv1[0] - center[1],2.0);
          local_b0 = sqrt(dVar3 + dVar1);
        }
        else {
          local_b0 = *radius;
        }
        *radius = local_b0;
        dVar3 = *radius;
        dVar1 = pow(_ref_private_macro_code_rss - *center,2.0);
        dVar2 = pow(uv2[0] - center[1],2.0);
        dVar1 = sqrt(dVar1 + dVar2);
        if (dVar3 <= dVar1) {
          dVar3 = pow(_ref_private_macro_code_rss - *center,2.0);
          dVar1 = pow(uv2[0] - center[1],2.0);
          local_d0 = sqrt(dVar3 + dVar1);
        }
        else {
          local_d0 = *radius;
        }
        *radius = local_d0;
        ref_geom_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xf63,"ref_geom_tri_uv_bounding_sphere3",(ulong)ref_geom_local._4_4_,"uv2");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf61,
             "ref_geom_tri_uv_bounding_sphere3",(ulong)ref_geom_local._4_4_,"uv1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf5f,
           "ref_geom_tri_uv_bounding_sphere3",(ulong)ref_geom_local._4_4_,"uv0");
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tri_uv_bounding_sphere3(REF_GEOM ref_geom,
                                                    REF_INT *nodes,
                                                    REF_DBL *center,
                                                    REF_DBL *radius) {
  REF_DBL uv0[2], uv1[2], uv2[2];
  REF_INT sens;

  RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_FACE, uv0, &sens),
      "uv0");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_FACE, uv1, &sens),
      "uv1");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[2], nodes, REF_GEOM_FACE, uv2, &sens),
      "uv2");

  center[0] = (uv0[0] + uv1[0] + uv2[0]) / 3.0;
  center[1] = (uv0[1] + uv1[1] + uv2[1]) / 3.0;

  *radius = 0.0;
  *radius = MAX(*radius,
                sqrt(pow(uv0[0] - center[0], 2) + pow(uv0[1] - center[1], 2)));
  *radius = MAX(*radius,
                sqrt(pow(uv1[0] - center[0], 2) + pow(uv1[1] - center[1], 2)));
  *radius = MAX(*radius,
                sqrt(pow(uv2[0] - center[0], 2) + pow(uv2[1] - center[1], 2)));

  return REF_SUCCESS;
}